

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::constructAggregate
          (HlslParseContext *this,TIntermNode *node,TType *type,int paramCount,TSourceLoc *loc)

{
  TIntermediate *this_00;
  TIntermTyped *pTVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *pTVar5;
  char *pcVar6;
  char *pcVar7;
  pool_allocator<char> local_150;
  TString local_148;
  pool_allocator<char> local_120;
  TString local_118;
  TString local_f0;
  pool_allocator<char> local_c8;
  TString local_c0;
  pool_allocator<char> local_98;
  TString local_90;
  TString local_68;
  TIntermTyped *local_40;
  TIntermTyped *converted;
  TSourceLoc *loc_local;
  TType *pTStack_28;
  int paramCount_local;
  TType *type_local;
  TIntermNode *node_local;
  HlslParseContext *this_local;
  
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  converted = (TIntermTyped *)loc;
  loc_local._4_4_ = paramCount;
  pTStack_28 = type;
  type_local = (TType *)node;
  node_local = (TIntermNode *)this;
  iVar4 = (*node->_vptr_TIntermNode[3])();
  local_40 = TIntermediate::addConversion
                       (this_00,EOpConstructStruct,type,(TIntermTyped *)CONCAT44(extraout_var,iVar4)
                       );
  if (local_40 != (TIntermTyped *)0x0) {
    iVar4 = (*(local_40->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar3 = TType::operator!=((TType *)CONCAT44(extraout_var_00,iVar4),pTStack_28);
    if (!bVar3) {
      return local_40;
    }
  }
  uVar2 = loc_local._4_4_;
  pTVar1 = converted;
  iVar4 = (*type_local->_vptr_TType[3])();
  pTVar5 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0xf0))();
  pool_allocator<char>::pool_allocator(&local_98);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_90,""
             ,&local_98);
  pool_allocator<char>::pool_allocator(&local_c8);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_c0,""
             ,&local_c8);
  TType::getCompleteString(&local_68,pTVar5,false,true,true,true,&local_90,&local_c0);
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str(&local_68);
  pTVar5 = pTStack_28;
  pool_allocator<char>::pool_allocator(&local_120);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_118,
             "",&local_120);
  pool_allocator<char>::pool_allocator(&local_150);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_148,
             "",&local_150);
  TType::getCompleteString(&local_f0,pTVar5,false,true,true,true,&local_118,&local_148);
  pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str(&local_f0);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,pTVar1,"","constructor","cannot convert parameter %d from \'%s\' to \'%s\'",
             (ulong)uVar2,pcVar6,pcVar7);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_f0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_148);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_118);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_c0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_90);
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* HlslParseContext::constructAggregate(TIntermNode* node, const TType& type, int paramCount,
                                                   const TSourceLoc& loc)
{
    // Handle cases that map more 1:1 between constructor arguments and constructed.
    TIntermTyped* converted = intermediate.addConversion(EOpConstructStruct, type, node->getAsTyped());
    if (converted == nullptr || converted->getType() != type) {
        error(loc, "", "constructor", "cannot convert parameter %d from '%s' to '%s'", paramCount,
            node->getAsTyped()->getType().getCompleteString().c_str(), type.getCompleteString().c_str());

        return nullptr;
    }

    return converted;
}